

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O0

void Curl_llist_insert_next(Curl_llist *list,Curl_llist_node *e,void *p,Curl_llist_node *ne)

{
  Curl_llist_node *local_30;
  Curl_llist_node *ne_local;
  void *p_local;
  Curl_llist_node *e_local;
  Curl_llist *list_local;
  
  ne->_ptr = p;
  ne->_list = list;
  if (list->_size == 0) {
    list->_head = ne;
    list->_head->_prev = (Curl_llist_node *)0x0;
    list->_head->_next = (Curl_llist_node *)0x0;
    list->_tail = ne;
  }
  else {
    if (e == (Curl_llist_node *)0x0) {
      local_30 = list->_head;
    }
    else {
      local_30 = e->_next;
    }
    ne->_next = local_30;
    ne->_prev = e;
    if (e == (Curl_llist_node *)0x0) {
      list->_head->_prev = ne;
      list->_head = ne;
    }
    else if (e->_next == (Curl_llist_node *)0x0) {
      list->_tail = ne;
    }
    else {
      e->_next->_prev = ne;
    }
    if (e != (Curl_llist_node *)0x0) {
      e->_next = ne;
    }
  }
  list->_size = list->_size + 1;
  return;
}

Assistant:

void
Curl_llist_insert_next(struct Curl_llist *list,
                       struct Curl_llist_node *e, /* may be NULL */
                       const void *p,
                       struct Curl_llist_node *ne)
{
  DEBUGASSERT(list);
  DEBUGASSERT(list->_init == LLISTINIT);
  DEBUGASSERT(ne);

#ifdef DEBUGBUILD
  ne->_init = NODEINIT;
#endif
  ne->_ptr = (void *) p;
  ne->_list = list;
  if(list->_size == 0) {
    list->_head = ne;
    list->_head->_prev = NULL;
    list->_head->_next = NULL;
    list->_tail = ne;
  }
  else {
    /* if 'e' is NULL here, we insert the new element first in the list */
    ne->_next = e ? e->_next : list->_head;
    ne->_prev = e;
    if(!e) {
      list->_head->_prev = ne;
      list->_head = ne;
    }
    else if(e->_next) {
      e->_next->_prev = ne;
    }
    else {
      list->_tail = ne;
    }
    if(e)
      e->_next = ne;
  }

  ++list->_size;
}